

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

int uv_sem_trywait(uv_sem_t *sem)

{
  uv_mutex_t *mutex;
  int iVar1;
  int *piVar2;
  int iVar3;
  
  if (platform_needs_custom_semaphore == 0) {
    do {
      iVar1 = sem_trywait((sem_t *)sem);
      if (iVar1 != -1) {
        if (iVar1 == 0) {
          return 0;
        }
        piVar2 = __errno_location();
        iVar1 = *piVar2;
        break;
      }
      piVar2 = __errno_location();
      iVar1 = *piVar2;
    } while (iVar1 == 4);
    iVar3 = -0xb;
    if (iVar1 != 0xb) {
LAB_00198306:
      abort();
    }
  }
  else {
    mutex = *(uv_mutex_t **)sem;
    iVar1 = uv_mutex_trylock(mutex);
    iVar3 = -0xb;
    if (iVar1 == 0) {
      if (*(int *)((long)mutex + 0x58) == 0) {
        iVar1 = pthread_mutex_unlock((pthread_mutex_t *)mutex);
      }
      else {
        *(int *)((long)mutex + 0x58) = *(int *)((long)mutex + 0x58) + -1;
        iVar1 = pthread_mutex_unlock((pthread_mutex_t *)mutex);
        iVar3 = 0;
      }
      if (iVar1 != 0) goto LAB_00198306;
    }
  }
  return iVar3;
}

Assistant:

int uv_sem_trywait(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    return uv__custom_sem_trywait(sem);
  else
    return uv__sem_trywait(sem);
}